

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

int xmlSchemaIsBuiltInTypeFacet(xmlSchemaTypePtr type,int facetType)

{
  int facetType_local;
  xmlSchemaTypePtr type_local;
  
  if (type == (xmlSchemaTypePtr)0x0) {
    type_local._4_4_ = -1;
  }
  else if (type->type == XML_SCHEMA_TYPE_BASIC) {
    switch(type->builtInType) {
    case 1:
    case 0x15:
    case 0x1c:
    case 0x1d:
    case 0x2b:
    case 0x2c:
      if (((facetType == 0x3f1) || (facetType == 0x3f3)) ||
         ((facetType == 0x3f2 ||
          (((facetType == 0x3ee || (facetType == 0x3ef)) || (facetType == 0x3f0)))))) {
        type_local._4_4_ = 1;
      }
      else {
        type_local._4_4_ = 0;
      }
      break;
    default:
      type_local._4_4_ = 0;
      break;
    case 3:
      if (((facetType == 0x3ec) || (facetType == 0x3ed)) ||
         (((facetType == 0x3ee ||
           (((facetType == 0x3f0 || (facetType == 0x3ef)) || (facetType == 0x3ea)))) ||
          (((facetType == 0x3eb || (facetType == 1000)) || (facetType == 0x3e9)))))) {
        type_local._4_4_ = 1;
      }
      else {
        type_local._4_4_ = 0;
      }
      break;
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
      if ((((facetType == 0x3ee) || (facetType == 0x3ef)) || (facetType == 0x3f0)) ||
         (((facetType == 0x3ea || (facetType == 0x3eb)) ||
          ((facetType == 1000 || (facetType == 0x3e9)))))) {
        type_local._4_4_ = 1;
      }
      else {
        type_local._4_4_ = 0;
      }
      break;
    case 0xf:
      if ((facetType == 0x3ee) || (facetType == 0x3f0)) {
        type_local._4_4_ = 1;
      }
      else {
        type_local._4_4_ = 0;
      }
    }
  }
  else {
    type_local._4_4_ = -1;
  }
  return type_local._4_4_;
}

Assistant:

int
xmlSchemaIsBuiltInTypeFacet(xmlSchemaTypePtr type, int facetType)
{
    if (type == NULL)
	return (-1);
    if (type->type != XML_SCHEMA_TYPE_BASIC)
	return (-1);
    switch (type->builtInType) {
	case XML_SCHEMAS_BOOLEAN:
	    if ((facetType == XML_SCHEMA_FACET_PATTERN) ||
		(facetType == XML_SCHEMA_FACET_WHITESPACE))
		return (1);
	    else
		return (0);
	case XML_SCHEMAS_STRING:
	case XML_SCHEMAS_NOTATION:
	case XML_SCHEMAS_QNAME:
	case XML_SCHEMAS_ANYURI:
	case XML_SCHEMAS_BASE64BINARY:
	case XML_SCHEMAS_HEXBINARY:
	    if ((facetType == XML_SCHEMA_FACET_LENGTH) ||
		(facetType == XML_SCHEMA_FACET_MINLENGTH) ||
		(facetType == XML_SCHEMA_FACET_MAXLENGTH) ||
		(facetType == XML_SCHEMA_FACET_PATTERN) ||
		(facetType == XML_SCHEMA_FACET_ENUMERATION) ||
		(facetType == XML_SCHEMA_FACET_WHITESPACE))
		return (1);
	    else
		return (0);
	case XML_SCHEMAS_DECIMAL:
	    if ((facetType == XML_SCHEMA_FACET_TOTALDIGITS) ||
		(facetType == XML_SCHEMA_FACET_FRACTIONDIGITS) ||
		(facetType == XML_SCHEMA_FACET_PATTERN) ||
		(facetType == XML_SCHEMA_FACET_WHITESPACE) ||
		(facetType == XML_SCHEMA_FACET_ENUMERATION) ||
		(facetType == XML_SCHEMA_FACET_MAXINCLUSIVE) ||
		(facetType == XML_SCHEMA_FACET_MAXEXCLUSIVE) ||
		(facetType == XML_SCHEMA_FACET_MININCLUSIVE) ||
		(facetType == XML_SCHEMA_FACET_MINEXCLUSIVE))
		return (1);
	    else
		return (0);
	case XML_SCHEMAS_TIME:
	case XML_SCHEMAS_GDAY:
	case XML_SCHEMAS_GMONTH:
	case XML_SCHEMAS_GMONTHDAY:
	case XML_SCHEMAS_GYEAR:
	case XML_SCHEMAS_GYEARMONTH:
	case XML_SCHEMAS_DATE:
	case XML_SCHEMAS_DATETIME:
	case XML_SCHEMAS_DURATION:
	case XML_SCHEMAS_FLOAT:
	case XML_SCHEMAS_DOUBLE:
	    if ((facetType == XML_SCHEMA_FACET_PATTERN) ||
		(facetType == XML_SCHEMA_FACET_ENUMERATION) ||
		(facetType == XML_SCHEMA_FACET_WHITESPACE) ||
		(facetType == XML_SCHEMA_FACET_MAXINCLUSIVE) ||
		(facetType == XML_SCHEMA_FACET_MAXEXCLUSIVE) ||
		(facetType == XML_SCHEMA_FACET_MININCLUSIVE) ||
		(facetType == XML_SCHEMA_FACET_MINEXCLUSIVE))
		return (1);
	    else
		return (0);
	default:
	    break;
    }
    return (0);
}